

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

int cpu_ld_floatx80_ra(CPUM68KState_conflict *env,uint32_t addr,FPReg_conflict *fp,uintptr_t ra)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t low;
  uint32_t high;
  uintptr_t ra_local;
  FPReg_conflict *fp_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = cpu_ldl_data_ra_m68k(env,addr,ra);
  uVar2 = cpu_ldq_data_ra_m68k(env,addr + 4,ra);
  (fp->d).high = (uint16_t)(uVar1 >> 0x10);
  (fp->d).low = uVar2;
  return 0xc;
}

Assistant:

static int cpu_ld_floatx80_ra(CPUM68KState *env, uint32_t addr, FPReg *fp,
                              uintptr_t ra)
{
    uint32_t high;
    uint64_t low;

    high = cpu_ldl_data_ra(env, addr, ra);
    low = cpu_ldq_data_ra(env, addr + 4, ra);

    fp->l.upper = high >> 16;
    fp->l.lower = low;

    return 12;
}